

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GateTypes.cpp
# Opt level: O1

void slang::ast::builtins::gate
               (Compilation *c,string_view name,
               initializer_list<slang::ast::PrimitivePortDirection> portDirs,
               PrimitiveKind primitiveKind)

{
  int iVar1;
  PrimitiveSymbol *prim;
  undefined4 extraout_var;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  size_t extraout_RDX_01;
  long lVar2;
  PrimitivePortDirection dir;
  PrimitivePortSymbol *port;
  SmallVector<const_slang::ast::PrimitivePortSymbol_*,_5UL> ports;
  PrimitivePortDirection local_94;
  PrimitivePortSymbol *local_90;
  PrimitiveKind local_84;
  SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*> local_80 [2];
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  local_40._M_str = name._M_str;
  local_40._M_len = name._M_len;
  local_84 = primitiveKind;
  prim = BumpAllocator::
         emplace<slang::ast::PrimitiveSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation_const&,slang::ast::PrimitiveSymbol::PrimitiveKind&>
                   (&c->super_BumpAllocator,c,&local_40,
                    (SourceLocation *)&SourceLocation::NoLocation,&local_84);
  Compilation::addGateType(c,prim);
  local_80[0].data_ = (pointer)local_80[0].firstElement;
  local_80[0].len = 0;
  local_80[0].cap = 5;
  src = extraout_RDX;
  if (portDirs._M_len != 0) {
    lVar2 = 0;
    do {
      local_94 = *(PrimitivePortDirection *)((long)portDirs._M_array + lVar2);
      local_90 = BumpAllocator::
                 emplace<slang::ast::PrimitivePortSymbol,slang::ast::Compilation&,char_const(&)[1],slang::SourceLocation_const&,slang::ast::PrimitivePortDirection&>
                           (&c->super_BumpAllocator,c,(char (*) [1])0x5009e0,
                            (SourceLocation *)&SourceLocation::NoLocation,&local_94);
      Scope::insertMember(&prim->super_Scope,(Symbol *)local_90,(prim->super_Scope).lastMember,false
                          ,true);
      SmallVectorBase<slang::ast::PrimitivePortSymbol_const*>::
      emplace_back<slang::ast::PrimitivePortSymbol_const*const&>
                ((SmallVectorBase<slang::ast::PrimitivePortSymbol_const*> *)local_80,&local_90);
      lVar2 = lVar2 + 4;
      src = extraout_RDX_00;
    } while (portDirs._M_len << 2 != lVar2);
  }
  iVar1 = SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::copy
                    (local_80,(EVP_PKEY_CTX *)c,src);
  (prim->ports)._M_ptr = (pointer)CONCAT44(extraout_var,iVar1);
  (prim->ports)._M_extent._M_extent_value = extraout_RDX_01;
  if (local_80[0].data_ != (pointer)local_80[0].firstElement) {
    operator_delete(local_80[0].data_);
  }
  return;
}

Assistant:

static void gate(Compilation& c, std::string_view name,
                 std::initializer_list<PrimitivePortDirection> portDirs,
                 PrimitiveSymbol::PrimitiveKind primitiveKind = PrimitiveSymbol::Fixed) {
    auto& prim = *c.emplace<PrimitiveSymbol>(c, name, NL, primitiveKind);
    c.addGateType(prim);

    SmallVector<const PrimitivePortSymbol*> ports;
    for (auto dir : portDirs) {
        auto port = c.emplace<PrimitivePortSymbol>(c, "", NL, dir);
        prim.addMember(*port);
        ports.push_back(port);
    }

    prim.ports = ports.copy(c);
}